

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall leveldb::anon_unknown_1::PosixEnv::DeleteDir(PosixEnv *this,string *name)

{
  int iVar1;
  char *__path;
  int *piVar2;
  string *in_RDX;
  Status local_30;
  undefined1 local_21;
  string *local_20;
  string *name_local;
  PosixEnv *this_local;
  Status *result;
  
  local_21 = 0;
  local_20 = in_RDX;
  name_local = name;
  this_local = this;
  Status::Status((Status *)this);
  __path = (char *)std::__cxx11::string::c_str();
  iVar1 = rmdir(__path);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    IOError((anon_unknown_1 *)&local_30,local_20,*piVar2);
    Status::operator=((Status *)this,&local_30);
    Status::~Status(&local_30);
  }
  return (Status)(char *)this;
}

Assistant:

virtual Status DeleteDir(const std::string &name) {
                Status result;
                if (rmdir(name.c_str()) != 0) {
                    result = IOError(name, errno);
                }
                return result;
            }